

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

int secp256k1_ge_set_xquad(secp256k1_ge *r,secp256k1_fe *x)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  int iVar6;
  secp256k1_fe x3;
  secp256k1_fe x2;
  
  secp256k1_fe_verify(x);
  uVar1 = x->n[0];
  uVar2 = x->n[1];
  uVar3 = x->n[2];
  uVar4 = x->n[3];
  iVar6 = x->magnitude;
  iVar5 = x->normalized;
  (r->x).n[4] = x->n[4];
  (r->x).magnitude = iVar6;
  (r->x).normalized = iVar5;
  (r->x).n[2] = uVar3;
  (r->x).n[3] = uVar4;
  (r->x).n[0] = uVar1;
  (r->x).n[1] = uVar2;
  secp256k1_fe_sqr(&x2,x);
  secp256k1_fe_mul(&x3,x,&x2);
  r->infinity = 0;
  secp256k1_fe_add_int(&x3,7);
  iVar6 = secp256k1_fe_sqrt(&r->y,&x3);
  return iVar6;
}

Assistant:

static int secp256k1_ge_set_xquad(secp256k1_ge *r, const secp256k1_fe *x) {
    secp256k1_fe x2, x3;
    secp256k1_fe_verify(x);
    r->x = *x;
    secp256k1_fe_sqr(&x2, x);
    secp256k1_fe_mul(&x3, x, &x2);
    r->infinity = 0;
    secp256k1_fe_add_int(&x3, SECP256K1_B);
    return secp256k1_fe_sqrt(&r->y, &x3);
}